

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O2

Maybe<kj::StringTree> * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeBrandDepInitializer
          (Maybe<kj::StringTree> *__return_storage_ptr__,CapnpcCppMain *this,Method method,
          StructSchema type,StringPtr suffix)

{
  Schema this_00;
  CppTypeName *name_00;
  CapnpcCppMain *this_01;
  StringPtr SVar1;
  StringPtr name_01;
  StringPtr innerName;
  CppTypeName name;
  Reader typeProto;
  Schema local_178;
  Array<char> local_170;
  undefined1 local_158 [56];
  undefined1 local_120 [16];
  undefined1 local_110 [80];
  long local_c0;
  uint local_b0;
  StringTree local_a0;
  CppTypeName local_60;
  
  local_120._8_8_ = suffix.content.size_;
  local_120._0_8_ = suffix.content.ptr;
  local_178 = type.super_Schema.raw;
  Schema::getProto((Reader *)(local_110 + 0x40),&local_178);
  if ((local_b0 < 0xc0) || (*(long *)(local_c0 + 0x10) == 0)) {
    name_00 = &local_60;
    local_60.name.size_._0_1_ = 0;
    this_01 = (CapnpcCppMain *)local_110;
    cppFullName((CppTypeName *)this_01,this,method.parent.super_Schema.raw,
                (Maybe<capnp::InterfaceSchema::Method> *)name_00);
    SVar1 = protoName<capnp::schema::Method::Reader>(this_01,method.proto._reader);
    name_01.content.ptr = (char *)SVar1.content.size_;
    name_01.content.size_ = (size_t)name_00;
    toTitleCase((String *)local_158,(CapnpcCppMain *)SVar1.content.ptr,name_01);
    kj::str<kj::String,kj::StringPtr&>
              ((String *)&local_170,(kj *)local_158,(String *)local_120,(StringPtr *)name_00);
    kj::Array<char>::~Array((Array<char> *)local_158);
    capnp::schema::Node::Reader::getParameters((Reader *)local_158,(Reader *)(local_110 + 0x40));
    if (local_170.size_ == 0) {
      local_170.ptr = "";
    }
    SVar1.content.size_ = local_170.size_ + (local_170.size_ == 0);
    if (local_158._24_4_ == 0) {
      innerName.content.size_ = SVar1.content.size_;
      innerName.content.ptr = local_170.ptr;
      CppTypeName::addMemberType((CppTypeName *)local_110,innerName);
    }
    else {
      name_00 = (CppTypeName *)local_158;
      local_158._0_8_ = (CppTypeName *)0x0;
      local_158._8_8_ = (CapTableReader *)0x0;
      local_158._16_8_ = (ArrayDisposer *)0x0;
      SVar1.content.ptr = local_170.ptr;
      CppTypeName::addMemberTemplate
                ((CppTypeName *)local_110,SVar1,
                 (Array<capnp::(anonymous_namespace)::CppTypeName> *)name_00);
      kj::Array<capnp::(anonymous_namespace)::CppTypeName>::~Array
                ((Array<capnp::(anonymous_namespace)::CppTypeName> *)local_158);
    }
    this_00.raw = local_178.raw;
    CppTypeName::CppTypeName((CppTypeName *)&local_a0,(CppTypeName *)local_110);
    makeBrandDepInitializer
              (__return_storage_ptr__,(CapnpcCppMain *)this_00.raw,(RawBrandedSchema *)&local_a0,
               name_00);
    kj::StringTree::~StringTree(&local_a0);
    kj::Array<char>::~Array(&local_170);
    kj::StringTree::~StringTree((StringTree *)local_110);
  }
  else {
    makeBrandDepInitializer(__return_storage_ptr__,this,local_178);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::StringTree> makeBrandDepInitializer(
      InterfaceSchema::Method method, StructSchema type, kj::StringPtr suffix) {
    auto typeProto = type.getProto();
    if (typeProto.getScopeId() == 0) {
      // This is an auto-generated params or results type.
      auto name = cppFullName(method.getContainingInterface(), nullptr);
      auto memberTypeName = kj::str(toTitleCase(protoName(method.getProto())), suffix);

      if (typeProto.getParameters().size() == 0) {
        name.addMemberType(memberTypeName);
      } else {
        // The method has implicit parameters (i.e. it's generic). For the purpose of the brand
        // dep initializer, we only want to supply the default AnyPointer variant, so just don't
        // pass any parameters here.
        name.addMemberTemplate(memberTypeName, nullptr);
      }
      return makeBrandDepInitializer(type, kj::mv(name));
    } else {
      return makeBrandDepInitializer(type);
    }
  }